

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall
helics::apps::App::loadJsonFileConfiguration
          (App *this,string *appName,string *jsonString,bool enableFederateInterfaceRegistration)

{
  bool bVar1;
  undefined1 uVar2;
  element_type *peVar3;
  byte in_CL;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type *appConfig_2;
  value_type *appConfig_1;
  value_type *appConfig;
  json doc;
  string *in_stack_000001c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  reference in_stack_ffffffffffffff50;
  JsonBuffer in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff80;
  key_type *in_stack_ffffffffffffff98;
  JsonBuffer in_stack_ffffffffffffffa0;
  reference in_stack_ffffffffffffffa8;
  JsonBuffer in_stack_ffffffffffffffb0;
  
  if ((in_CL & 1) != 0) {
    peVar3 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fb38f);
    (*(peVar3->super_ValueFederate)._vptr_ValueFederate[3])(peVar3,in_RDX);
  }
  fileops::loadJson(in_stack_000001c8);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[4],_0>
                    (in_stack_ffffffffffffff50,
                     (char (*) [4])CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  if (bVar1) {
    in_stack_ffffffffffffff50 =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    fileops::JsonBuffer::JsonBuffer
              ((JsonBuffer *)&stack0xffffffffffffffb0,in_stack_ffffffffffffff50);
    loadConfigOptions((App *)in_stack_ffffffffffffffb0.reference,
                      (JsonBuffer *)in_stack_ffffffffffffffa8);
  }
  uVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>
                    (in_stack_ffffffffffffff50,
                     (char (*) [7])CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  if ((bool)uVar2) {
    in_stack_ffffffffffffffa8 =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    fileops::JsonBuffer::JsonBuffer
              ((JsonBuffer *)&stack0xffffffffffffffa0,in_stack_ffffffffffffffa8);
    loadConfigOptions((App *)in_stack_ffffffffffffffb0.reference,
                      (JsonBuffer *)in_stack_ffffffffffffffa8);
  }
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains(in_stack_ffffffffffffff50,(key_type *)CONCAT17(uVar2,in_stack_ffffffffffffff48)
                    );
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70.reference,in_RDI);
    in_stack_ffffffffffffff30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
         ::operator[](in_stack_ffffffffffffffa0.reference,in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(in_stack_ffffffffffffff30);
    fileops::JsonBuffer::JsonBuffer
              ((JsonBuffer *)&stack0xffffffffffffff70,(json *)in_stack_ffffffffffffff30);
    loadConfigOptions((App *)in_stack_ffffffffffffffb0.reference,
                      (JsonBuffer *)in_stack_ffffffffffffffa8);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

void App::loadJsonFileConfiguration(const std::string& appName,
                                    const std::string& jsonString,
                                    bool enableFederateInterfaceRegistration)
{
    if (enableFederateInterfaceRegistration) {
        fed->registerInterfaces(jsonString);
    }
    auto doc = fileops::loadJson(jsonString);

    if (doc.contains("app")) {
        auto& appConfig = doc["app"];
        loadConfigOptions(appConfig);
    }
    if (doc.contains("config")) {
        auto& appConfig = doc["config"];
        loadConfigOptions(appConfig);
    }
    if (doc.contains(appName)) {
        auto& appConfig = doc[appName];
        loadConfigOptions(appConfig);
    }
}